

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O0

uint __thiscall
cnn::ClassFactoredSoftmaxBuilder::sample(ClassFactoredSoftmaxBuilder *this,Expression *rep)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Tensor *v;
  vector<float,_std::allocator<float>_> *pvVar5;
  reference this_00;
  reference pvVar6;
  long in_RDI;
  real rVar7;
  vector<float,_std::allocator<float>_> wdist;
  Expression wscores;
  Expression *r2cw;
  Expression *cwbias;
  uint w;
  double p;
  uint c;
  vector<float,_std::allocator<float>_> cdist;
  Expression cscores;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  uint uVar8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  ClassFactoredSoftmaxBuilder *in_stack_fffffffffffffe60;
  Tensor *in_stack_fffffffffffffe78;
  vector<float,_std::allocator<float>_> local_140;
  undefined1 local_118 [48];
  undefined1 *local_e8;
  undefined8 local_e0;
  Expression *local_c8;
  Tensor *local_c0;
  reference local_b8;
  uint local_a8;
  double local_98;
  uint local_8c;
  vector<float,_std::allocator<float>_> local_88;
  undefined1 local_60 [48];
  undefined1 *local_30;
  undefined8 local_28;
  
  expr::Expression::Expression
            ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Expression *)in_stack_fffffffffffffe38);
  expr::Expression::Expression
            ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Expression *)in_stack_fffffffffffffe38);
  expr::Expression::Expression
            ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Expression *)in_stack_fffffffffffffe38);
  local_28 = 3;
  local_30 = local_60;
  expr::affine_transform(in_stack_fffffffffffffe38);
  expr::softmax((Expression *)in_stack_fffffffffffffe78);
  ComputationGraph::incremental_forward((ComputationGraph *)0x4e2d51);
  as_vector(in_stack_fffffffffffffe78);
  local_8c = 0;
  rVar7 = rand01();
  local_98 = (double)rVar7;
  for (; uVar2 = (ulong)local_8c,
      sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_88), uVar2 < sVar3;
      local_8c = local_8c + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_88,(ulong)local_8c);
    local_98 = local_98 - (double)*pvVar4;
    if (local_98 < 0.0) break;
  }
  uVar2 = (ulong)local_8c;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_88);
  if (uVar2 == sVar3) {
    local_8c = local_8c - 1;
  }
  local_a8 = 0;
  local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    v = (Tensor *)get_rc2wbias(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    local_c0 = v;
    local_c8 = get_rc2w(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    expr::Expression::Expression
              ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (Expression *)in_stack_fffffffffffffe38);
    expr::Expression::Expression
              ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (Expression *)in_stack_fffffffffffffe38);
    expr::Expression::Expression
              ((Expression *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (Expression *)in_stack_fffffffffffffe38);
    local_e0 = 3;
    local_e8 = local_118;
    expr::affine_transform(in_stack_fffffffffffffe38);
    expr::softmax((Expression *)v);
    ComputationGraph::incremental_forward((ComputationGraph *)0x4e2fae);
    as_vector(v);
    rVar7 = rand01();
    local_98 = (double)rVar7;
    while( true ) {
      in_stack_fffffffffffffe50 = (vector<float,_std::allocator<float>_> *)(ulong)local_a8;
      pvVar5 = (vector<float,_std::allocator<float>_> *)
               std::vector<float,_std::allocator<float>_>::size(&local_140);
      if (pvVar5 <= in_stack_fffffffffffffe50) break;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_140,(ulong)local_a8);
      local_98 = local_98 - (double)*pvVar4;
      if (local_98 < 0.0) break;
      local_a8 = local_a8 + 1;
    }
    uVar2 = (ulong)local_a8;
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_140);
    if (uVar2 == sVar3) {
      local_a8 = local_a8 - 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe50);
  }
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)(in_RDI + 0x88),(ulong)local_8c);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(ulong)local_a8);
  uVar8 = *pvVar6;
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe50);
  return uVar8;
}

Assistant:

unsigned ClassFactoredSoftmaxBuilder::sample(const expr::Expression& rep) {
  // TODO assert that new_graph has been called
  Expression cscores = affine_transform({cbias, r2c, rep});
  softmax(cscores);
  auto cdist = as_vector(pcg->incremental_forward());
  unsigned c = 0;
  double p = rand01();
  for (; c < cdist.size(); ++c) {
    p -= cdist[c];
    if (p < 0.0) { break; }
  }
  if (c == cdist.size()) --c;
  unsigned w = 0;
  if (!singleton_cluster[c]) {
    Expression& cwbias = get_rc2wbias(c);
    Expression& r2cw = get_rc2w(c);
    Expression wscores = affine_transform({cwbias, r2cw, rep});
    softmax(wscores);
    auto wdist = as_vector(pcg->incremental_forward());
    p = rand01();
    for (; w < wdist.size(); ++w) {
      p -= wdist[w];
      if (p < 0.0) { break; }
    }
    if (w == wdist.size()) --w;
  }
  return cidx2words[c][w];
}